

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_line_container_test.cpp
# Opt level: O2

void queryTest(int absBound)

{
  pointer *this;
  int iVar1;
  ll lhs;
  ll rhs;
  long x;
  char *message;
  int iVar2;
  undefined1 __x [8];
  bool bVar3;
  undefined1 local_b0 [8];
  vector<Line,_std::allocator<Line>_> linesToAdd;
  LineContainer lc;
  vector<Line,_std::allocator<Line>_> lines;
  AssertHelper local_58;
  value_type *local_50;
  value_type *local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._12_8_ = 0;
  linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  genLines((vector<Line,_std::allocator<Line>_> *)local_b0,100,-absBound,absBound,-absBound,absBound
          );
  lc.qi = 0;
  lc._28_4_ = 0;
  lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  sortLines((vector<Line,_std::allocator<Line>_> *)local_b0);
  local_48 = linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
             super__Vector_impl_data._M_start;
  this = &lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  __x = local_b0;
  while (__x != (undefined1  [8])local_48) {
    std::vector<Line,_std::allocator<Line>_>::push_back
              ((vector<Line,_std::allocator<Line>_> *)&lc.qi,(value_type *)__x);
    LineContainer::add((LineContainer *)
                       &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,((value_type *)__x)->k,
                       ((value_type *)__x)->m);
    iVar2 = 10;
    local_50 = (value_type *)__x;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      iVar1 = rand();
      x = (long)(iVar1 % 2000 + -1000);
      lhs = naiveQuery((vector<Line,_std::allocator<Line>_> *)&lc.qi,x);
      rhs = LineContainer::query
                      ((LineContainer *)
                       &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,x);
      testing::internal::CmpHelperEQ(local_40,"naiveQuery(lines, x)","lc.query(x)",lhs,rhs);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)this);
        message = "";
        if (gtest_ar._0_8_ != 0) {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/data-structures/fast_line_container_test.cpp"
                   ,0x2a,message);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)this);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
    }
    __x = (undefined1  [8])(local_50 + 1);
  }
  std::_Vector_base<Line,_std::allocator<Line>_>::~_Vector_base
            ((_Vector_base<Line,_std::allocator<Line>_> *)&lc.qi);
  std::_Vector_base<Line,_std::allocator<Line>_>::~_Vector_base
            ((_Vector_base<Line,_std::allocator<Line>_> *)local_b0);
  std::_Vector_base<Line,_std::allocator<Line>_>::~_Vector_base
            ((_Vector_base<Line,_std::allocator<Line>_> *)
             &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void queryTest(int absBound) {
    LineContainer lc;
    vector<Line> linesToAdd = genLines(100, -absBound,absBound,-absBound,absBound),
                 lines;
    
    sortLines(linesToAdd);
    for(auto & l : linesToAdd) {
        lines.push_back(l);
        lc.add(l.k, l.m);
        rep(qit, 0, 10) {
            int x = randrange(-1000, 1000);
            EXPECT_EQ(naiveQuery(lines, x), lc.query(x));
        }
    }
}